

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImNodes.cpp
# Opt level: O0

void __thiscall ImNodes::CanvasState::CanvasState(CanvasState *this)

{
  _CanvasStateImpl *this_00;
  ImColor *local_a8;
  ImVec4 local_98;
  ImVec4 local_88;
  ImVec4 local_78;
  ImVec4 local_68;
  ImVec4 local_58;
  ImVec4 local_48;
  ImVec4 local_38;
  ImVec4 local_28;
  ImGuiStyle *local_18;
  ImGuiStyle *imgui_style;
  CanvasState *this_local;
  
  this->zoom = 1.0;
  imgui_style = (ImGuiStyle *)this;
  ImVec2::ImVec2(&this->offset);
  local_a8 = this->colors;
  do {
    ImColor::ImColor(local_a8);
    local_a8 = local_a8 + 1;
  } while ((anon_struct_8_2_663fa02e_for_style *)local_a8 != &this->style);
  (this->style).curve_thickness = 0.0;
  (this->style).connection_indent = 0.0;
  {unnamed_type#1}::CanvasState((_unnamed_type_1_ *)&this->style);
  this->_impl = (_CanvasStateImpl *)0x0;
  this_00 = (_CanvasStateImpl *)operator_new(0xa8);
  this_00->prev_canvas = (CanvasState *)0x0;
  (this_00->ignore_connections).Size = 0;
  (this_00->ignore_connections).Capacity = 0;
  this_00->do_selections_frame = 0;
  this_00->state = State_None;
  *(undefined8 *)&this_00->just_connected = 0;
  *(undefined8 *)&this_00->drag_node_selected = 0;
  this_00->single_selected_node = (void *)0x0;
  (this_00->selection_start).x = 0.0;
  (this_00->selection_start).y = 0.0;
  this_00->drag_node = (void *)0x0;
  (this_00->new_connection).output_node = (void *)0x0;
  (this_00->new_connection).output_slot = (char *)0x0;
  (this_00->new_connection).input_node = (void *)0x0;
  (this_00->new_connection).input_slot = (char *)0x0;
  (this_00->slot).title = (char *)0x0;
  this_00->auto_position_node_id = (void *)0x0;
  (this_00->node).selected = (bool *)0x0;
  *(undefined8 *)&this_00->slot = 0;
  (this_00->node).id = (void *)0x0;
  (this_00->node).pos = (ImVec2 *)0x0;
  (this_00->cached_data).Data.Size = 0;
  (this_00->cached_data).Data.Capacity = 0;
  (this_00->cached_data).Data.Data = (Pair *)0x0;
  (this_00->ignore_connections).Data = (_IgnoreSlot *)0x0;
  _CanvasStateImpl::_CanvasStateImpl(this_00);
  this->_impl = this_00;
  local_18 = ImGui::GetStyle();
  ImColor::ImColor((ImColor *)&local_28,local_18->Colors + 0x1b);
  this->colors[0].Value.x = local_28.x;
  this->colors[0].Value.y = local_28.y;
  this->colors[0].Value.z = local_28.z;
  this->colors[0].Value.w = local_28.w;
  ImColor::ImColor((ImColor *)&local_38,local_18->Colors + 2);
  this->colors[1].Value.x = local_38.x;
  this->colors[1].Value.y = local_38.y;
  this->colors[1].Value.z = local_38.z;
  this->colors[1].Value.w = local_38.w;
  ImColor::ImColor((ImColor *)&local_48,local_18->Colors + 9);
  this->colors[2].Value.x = local_48.x;
  this->colors[2].Value.y = local_48.y;
  this->colors[2].Value.z = local_48.z;
  this->colors[2].Value.w = local_48.w;
  ImColor::ImColor((ImColor *)&local_58,local_18->Colors + 5);
  this->colors[3].Value.x = local_58.x;
  this->colors[3].Value.y = local_58.y;
  this->colors[3].Value.z = local_58.z;
  this->colors[3].Value.w = local_58.w;
  ImColor::ImColor((ImColor *)&local_68,local_18->Colors + 0x26);
  this->colors[4].Value.x = local_68.x;
  this->colors[4].Value.y = local_68.y;
  this->colors[4].Value.z = local_68.z;
  this->colors[4].Value.w = local_68.w;
  ImColor::ImColor((ImColor *)&local_78,local_18->Colors + 0x27);
  this->colors[5].Value.x = local_78.x;
  this->colors[5].Value.y = local_78.y;
  this->colors[5].Value.z = local_78.z;
  this->colors[5].Value.w = local_78.w;
  ImColor::ImColor((ImColor *)&local_88,local_18->Colors + 9);
  this->colors[6].Value.x = local_88.x;
  this->colors[6].Value.y = local_88.y;
  this->colors[6].Value.z = local_88.z;
  this->colors[6].Value.w = local_88.w;
  this->colors[6].Value.w = 0.25;
  ImColor::ImColor((ImColor *)&local_98,local_18->Colors + 5);
  this->colors[7].Value.x = local_98.x;
  this->colors[7].Value.y = local_98.y;
  this->colors[7].Value.z = local_98.z;
  this->colors[7].Value.w = local_98.w;
  return;
}

Assistant:

CanvasState::CanvasState() noexcept
{
    _impl = new _CanvasStateImpl();

    auto& imgui_style = ImGui::GetStyle();
    colors[ColCanvasLines] = imgui_style.Colors[ImGuiCol_Separator];
    colors[ColNodeBg] = imgui_style.Colors[ImGuiCol_WindowBg];
    colors[ColNodeActiveBg] = imgui_style.Colors[ImGuiCol_FrameBgActive];
    colors[ColNodeBorder] = imgui_style.Colors[ImGuiCol_Border];
    colors[ColConnection] = imgui_style.Colors[ImGuiCol_PlotLines];
    colors[ColConnectionActive] = imgui_style.Colors[ImGuiCol_PlotLinesHovered];
    colors[ColSelectBg] = imgui_style.Colors[ImGuiCol_FrameBgActive];
    colors[ColSelectBg].Value.w = 0.25f;
    colors[ColSelectBorder] = imgui_style.Colors[ImGuiCol_Border];
}